

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  Finder *pFVar1;
  long lVar2;
  OneofDescriptor *oneof_descriptor;
  size_t sVar3;
  _Alloc_hider _Var4;
  undefined8 __n;
  ParserImpl *this_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CppType CVar8;
  ParseLocation this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExtensionRange *pEVar9;
  undefined4 extraout_var_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined4 extraout_var_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Descriptor *pDVar12;
  long *plVar13;
  ReservedRange *pRVar14;
  FieldDescriptor *pFVar15;
  MessageFactory *factory;
  undefined8 *puVar16;
  LogMessage *other;
  MessageLite *this_02;
  size_type *psVar17;
  Reflection *extraout_RDX;
  char *pcVar18;
  code *pcVar19;
  ulong uVar20;
  ulong uVar21;
  _Alloc_hider _Var22;
  string full_type_name;
  string serialized_value;
  string prefix;
  string field_name;
  int32 field_number;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [2];
  Reflection *local_158;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [32];
  ParserImpl *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ParseLocation local_a8;
  FieldDescriptor *local_a0;
  FieldDescriptor *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int extraout_var;
  undefined4 extraout_var_04;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_158 = extraout_RDX;
  this_01.line = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  this_01.column = extraout_var;
  local_f0._0_8_ = local_f0 + 0x10;
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_a8.line = (this->tokenizer_).current_.line;
  local_a8.column = (this->tokenizer_).current_.column;
  bVar5 = internal::GetAnyFieldDescriptors(message,&local_98,&local_a0);
  local_190._0_8_ = local_190 + 0x10;
  if (bVar5) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[","");
    bVar5 = TryConsume(this,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
    local_190._0_8_ = local_190 + 0x10;
    if (bVar5) {
      local_190._8_8_ = (char *)0x0;
      local_180[0]._M_allocated_capacity = local_180[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      bVar5 = ConsumeAnyTypeUrl(this,(string *)local_190,&local_130);
      if (bVar5) {
        paVar11 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"]","");
        bVar5 = Consume(this,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar11) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if (!bVar5) goto LAB_002a9030;
        local_150._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,":","");
        TryConsume(this,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar11) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        local_150._M_string_length = 0;
        local_150.field_2._M_allocated_capacity =
             local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          local_150._M_dataplus._M_p = (pointer)paVar11;
          pDVar12 = anon_unknown_19::DefaultFinderFindAnyType
                              (message,&local_130,(string *)local_190);
        }
        else {
          local_150._M_dataplus._M_p = (pointer)paVar11;
          iVar7 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&local_130,local_190);
          pDVar12 = (Descriptor *)CONCAT44(extraout_var_00,iVar7);
        }
        if (pDVar12 == (Descriptor *)0x0) {
          std::operator+(&local_90,"Could not find type \"",&local_130);
          plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_90,local_190._0_8_);
          psVar17 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_c8.field_2._M_allocated_capacity = *psVar17;
            local_c8.field_2._8_8_ = plVar13[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar17;
            local_c8._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_c8._M_string_length = plVar13[1];
          *plVar13 = (long)psVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_c8);
          psVar17 = (size_type *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_110.field_2._M_allocated_capacity = *psVar17;
            local_110.field_2._8_8_ = plVar13[3];
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar17;
            local_110._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_110._M_string_length = plVar13[1];
          *plVar13 = (long)psVar17;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      &local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_002a9cd1:
            operator_delete(local_90._M_dataplus._M_p);
          }
LAB_002a9cd6:
          bVar5 = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,pDVar12,&local_150);
          if (!bVar5) goto LAB_002a9cd6;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(local_98 + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(local_158,message,local_98), bVar5)) ||
              ((*(int *)(local_a0 + 0x3c) != 3 &&
               (bVar5 = Reflection::HasField(local_158,message,local_a0), bVar5)))))) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"Non-repeated Any specified multiple times.","");
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        &local_110);
            local_90._M_dataplus._M_p = local_110._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_002a9cd1;
            goto LAB_002a9cd6;
          }
          std::operator+(&local_50,&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190);
          Reflection::SetString(local_158,message,local_98,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_150._M_dataplus._M_p,
                     (FieldDescriptor *)(local_150._M_dataplus._M_p + local_150._M_string_length));
          Reflection::SetString(local_158,message,local_a0,&local_70);
          bVar5 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar11) {
          operator_delete(local_150._M_dataplus._M_p);
        }
      }
      else {
LAB_002a9030:
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_);
      }
      goto LAB_002aa2d2;
    }
  }
  local_190._0_8_ = local_190 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[","");
  bVar5 = TryConsume(this,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,(string *)local_f0);
    if (bVar5) {
      local_190._0_8_ = local_190 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]","");
      bVar5 = Consume(this,(string *)local_190);
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_);
      }
      if (bVar5) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)DescriptorPool::FindExtensionByPrintableName
                                 (*(DescriptorPool **)
                                   (*(long *)((Descriptor *)CONCAT44(extraout_var_03,iVar7) + 0x10)
                                   + 0x10),(Descriptor *)CONCAT44(extraout_var_03,iVar7),
                                  (string *)local_f0);
        }
        else {
          iVar7 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,local_f0);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(extraout_var_01,iVar7);
        }
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_002a95b4;
        if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
          std::operator+(&local_110,"Extension \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar16 == paVar11) {
            local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_150.field_2._8_8_ = puVar16[3];
          }
          else {
            local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_150._M_dataplus._M_p = (pointer)*puVar16;
          }
          local_150._M_string_length = puVar16[1];
          *puVar16 = paVar11;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          std::operator+(&local_130,&local_150,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          ((long)this_01 + 8));
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          local_190._0_8_ = local_190 + 0x10;
          pcVar19 = (code *)(puVar16 + 2);
          if ((code *)*puVar16 == pcVar19) {
            local_180[0]._0_8_ = *(undefined8 *)pcVar19;
            local_180[0]._8_8_ = puVar16[3];
          }
          else {
            local_180[0]._0_8_ = *(undefined8 *)pcVar19;
            local_190._0_8_ = (code *)*puVar16;
          }
          local_190._8_8_ = puVar16[1];
          *puVar16 = pcVar19;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_190);
          goto LAB_002aa284;
        }
        std::operator+(&local_110,"Ignoring extension \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 == paVar11) {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150.field_2._8_8_ = plVar13[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_150._M_string_length = plVar13[1];
        *plVar13 = (long)paVar11;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::operator+(&local_130,&local_150,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        ((long)this_01 + 8));
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_190._0_8_ = local_190 + 0x10;
        pcVar19 = (code *)(puVar16 + 2);
        if ((code *)*puVar16 == pcVar19) {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_180[0]._8_8_ = puVar16[3];
        }
        else {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_190._0_8_ = (code *)*puVar16;
        }
        local_190._8_8_ = puVar16[1];
        *puVar16 = pcVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        bVar6 = false;
LAB_002a9eab:
        if (((this->allow_unknown_field_ == false) && (!bVar6)) &&
           ((this->allow_unknown_extension_ & 1U) == 0)) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_190,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
                     ,0x1fb);
          other = internal::LogMessage::operator<<
                            ((LogMessage *)local_190,
                             "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                            );
          internal::LogFinisher::operator=((LogFinisher *)&local_130,other);
          internal::LogMessage::~LogMessage((LogMessage *)local_190);
        }
        local_190._0_8_ = local_190 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,":","");
        bVar5 = TryConsume(this,(string *)local_190);
        if (bVar5) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"{","");
          _Var22._M_p = local_130._M_dataplus._M_p;
          sVar3 = (this->tokenizer_).current_.text._M_string_length;
          if ((sVar3 == local_130._M_string_length) &&
             ((sVar3 == 0 ||
              (iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                            local_130._M_dataplus._M_p,sVar3), iVar7 == 0)))) {
            bVar5 = false;
          }
          else {
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"<","");
            _Var4._M_p = local_150._M_dataplus._M_p;
            sVar3 = (this->tokenizer_).current_.text._M_string_length;
            if (sVar3 == local_150._M_string_length) {
              if (sVar3 == 0) {
                bVar5 = false;
              }
              else {
                iVar7 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                             local_150._M_dataplus._M_p,sVar3);
                bVar5 = iVar7 != 0;
              }
            }
            else {
              bVar5 = true;
            }
            _Var22._M_p = local_130._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var4._M_p != &local_150.field_2) {
              operator_delete(_Var4._M_p);
              _Var22._M_p = local_130._M_dataplus._M_p;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var22._M_p != &local_130.field_2) {
            operator_delete(_Var22._M_p);
          }
        }
        else {
          bVar5 = false;
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if (bVar5) {
          bVar5 = SkipFieldValue(this);
        }
        else {
          bVar5 = SkipFieldMessage(this);
        }
        goto LAB_002aa2d2;
      }
    }
  }
  else {
    bVar5 = ConsumeIdentifier(this,(string *)local_f0);
    if (!bVar5) goto LAB_002aa2d0;
    local_d0 = this;
    if ((this->allow_field_number_ == true) &&
       (bVar5 = safe_strto32((string *)local_f0,(int32 *)&local_c8), bVar5)) {
      pEVar9 = Descriptor::FindExtensionRangeContainingNumber
                         ((Descriptor *)this_01,(int)local_c8._M_dataplus._M_p);
      if (pEVar9 == (ExtensionRange *)0x0) {
        pRVar14 = Descriptor::FindReservedRangeContainingNumber
                            ((Descriptor *)this_01,(int)local_c8._M_dataplus._M_p);
        bVar6 = true;
        this = local_d0;
        if (pRVar14 != (ReservedRange *)0x0) goto LAB_002a9eab;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)Descriptor::FindFieldByNumber
                               ((Descriptor *)this_01,(int)local_c8._M_dataplus._M_p);
      }
      else {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)DescriptorPool::FindExtensionByNumber
                                 (*(DescriptorPool **)(*(long *)((long)this_01 + 0x10) + 0x10),
                                  (Descriptor *)this_01,(int)local_c8._M_dataplus._M_p);
        }
        else {
          iVar7 = (*pFVar1->_vptr_Finder[3])(pFVar1,this_01);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(extraout_var_02,iVar7);
        }
      }
      this = local_d0;
      if (paVar11 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_002a95b4;
LAB_002a99d5:
      this_00 = local_d0;
      if (local_d0->allow_unknown_field_ != false) {
        std::operator+(&local_110,"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        ((long)this_01 + 8));
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar11) {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150.field_2._8_8_ = puVar16[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_150._M_string_length = puVar16[1];
        *puVar16 = paVar11;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::operator+(&local_130,&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_190._0_8_ = local_190 + 0x10;
        pcVar19 = (code *)(puVar16 + 2);
        if ((code *)*puVar16 == pcVar19) {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_180[0]._8_8_ = puVar16[3];
        }
        else {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_190._0_8_ = (code *)*puVar16;
        }
        local_190._8_8_ = puVar16[1];
        *puVar16 = pcVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ReportWarning(this_00,(this_00->tokenizer_).current_.line,
                      (this_00->tokenizer_).current_.column,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        bVar6 = false;
        this = local_d0;
        goto LAB_002a9eab;
      }
      std::operator+(&local_110,"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)this_01 + 8));
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 == paVar11) {
        local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_150.field_2._8_8_ = puVar16[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_150._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_150._M_string_length = puVar16[1];
      *puVar16 = paVar11;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      std::operator+(&local_130,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      local_190._0_8_ = local_190 + 0x10;
      pcVar19 = (code *)(puVar16 + 2);
      if ((code *)*puVar16 == pcVar19) {
        local_180[0]._0_8_ = *(undefined8 *)pcVar19;
        local_180[0]._8_8_ = puVar16[3];
      }
      else {
        local_180[0]._0_8_ = *(undefined8 *)pcVar19;
        local_190._0_8_ = (code *)*puVar16;
      }
      local_190._8_8_ = puVar16[1];
      *puVar16 = pcVar19;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      ReportError(this_00,(this_00->tokenizer_).current_.line,(this_00->tokenizer_).current_.column,
                  (string *)local_190);
LAB_002aa284:
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      paVar11 = &local_110.field_2;
    }
    else {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)Descriptor::FindFieldByName((Descriptor *)this_01,(string *)local_f0);
      if (paVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_190._0_8_ = local_190 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
        if ((char *)local_190._8_8_ != (char *)0x0) {
          pcVar18 = (char *)0x0;
          do {
            if ((byte)((char)*(code *)(local_190._0_8_ + (long)pcVar18) + 0xbfU) < 0x1a) {
              *(byte *)(local_190._0_8_ + (long)pcVar18) =
                   (byte)*(code *)(local_190._0_8_ + (long)pcVar18) | 0x20;
            }
            pcVar18 = pcVar18 + 1;
          } while ((char *)local_190._8_8_ != pcVar18);
        }
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)Descriptor::FindFieldByName((Descriptor *)this_01,(string *)local_190);
        if (paVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        else {
          if (*(once_flag **)(paVar10->_M_local_buf + 0x30) != (once_flag *)0x0) {
            local_130._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_150._M_dataplus._M_p = (pointer)paVar10;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(paVar10->_M_local_buf + 0x30),
                       (_func_void_FieldDescriptor_ptr **)&local_130,(FieldDescriptor **)&local_150)
            ;
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          if (*(int *)(paVar10->_M_local_buf + 0x38) == 10) {
            paVar11 = paVar10;
          }
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_002a931e;
LAB_002a9388:
        if (local_d0->allow_case_insensitive_field_ == true) {
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,local_f0._0_8_,(pointer)(local_f0._0_8_ + local_f0._8_8_));
          if ((char *)local_190._8_8_ != (char *)0x0) {
            pcVar18 = (char *)0x0;
            do {
              if ((byte)((char)*(code *)(local_190._0_8_ + (long)pcVar18) + 0xbfU) < 0x1a) {
                *(byte *)(local_190._0_8_ + (long)pcVar18) =
                     (byte)*(code *)(local_190._0_8_ + (long)pcVar18) | 0x20;
              }
              pcVar18 = pcVar18 + 1;
            } while ((char *)local_190._8_8_ != pcVar18);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)Descriptor::FindFieldByLowercaseName
                                 ((Descriptor *)this_01,(string *)local_190);
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
          }
          this = local_d0;
          if (paVar11 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_002a95b4;
        }
        __n = local_f0._8_8_;
        uVar20 = (ulong)*(int *)((long)this_01 + 0x84);
        if (0 < (long)uVar20) {
          lVar2 = *(long *)((long)this_01 + 0x60);
          local_158 = (Reflection *)local_f0._0_8_;
          bVar5 = true;
          uVar21 = 1;
          local_a8 = this_01;
          do {
            puVar16 = *(undefined8 **)(lVar2 + -8 + uVar21 * 8);
            if ((__n == puVar16[1]) &&
               ((__n == 0 || (iVar7 = bcmp(local_158,(void *)*puVar16,__n), iVar7 == 0)))) break;
            bVar5 = uVar21 < uVar20;
            bVar6 = uVar21 != uVar20;
            uVar21 = uVar21 + 1;
          } while (bVar6);
          bVar6 = true;
          this = local_d0;
          this_01 = local_a8;
          if (bVar5) goto LAB_002a9eab;
        }
        goto LAB_002a99d5;
      }
LAB_002a931e:
      if (*(once_flag **)(paVar11->_M_local_buf + 0x30) != (once_flag *)0x0) {
        local_190._0_8_ = FieldDescriptor::TypeOnceInit;
        local_130._M_dataplus._M_p = (pointer)paVar11;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(paVar11->_M_local_buf + 0x30),
                   (_func_void_FieldDescriptor_ptr **)local_190,(FieldDescriptor **)&local_130);
      }
      this = local_d0;
      if (*(int *)(paVar11->_M_local_buf + 0x38) == 10) {
        pDVar12 = FieldDescriptor::message_type((FieldDescriptor *)paVar11->_M_local_buf);
        sVar3 = (*(undefined8 **)pDVar12)[1];
        if ((sVar3 != local_f0._8_8_) ||
           ((this = local_d0, sVar3 != 0 &&
            (iVar7 = bcmp((void *)**(undefined8 **)pDVar12,(void *)local_f0._0_8_,sVar3),
            this = local_d0, iVar7 != 0)))) goto LAB_002a9388;
      }
LAB_002a95b4:
      if (this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) {
LAB_002a96d0:
        if (*(once_flag **)(paVar11->_M_local_buf + 0x30) != (once_flag *)0x0) {
          local_190._0_8_ = FieldDescriptor::TypeOnceInit;
          local_130._M_dataplus._M_p = (pointer)paVar11;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar11->_M_local_buf + 0x30),
                     (_func_void_FieldDescriptor_ptr **)local_190,(FieldDescriptor **)&local_130);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                    (ulong)*(uint *)(paVar11->_M_local_buf + 0x38) * 4) == 10) {
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_190,":","");
          bVar5 = TryConsume(this,(string *)local_190);
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
          }
          if (((!bVar5) || (*(char *)(*(long *)(paVar11->_M_local_buf + 0x78) + 0x4f) != '\x01')) ||
             ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_002a9803;
          local_190._0_8_ = local_190 + 0x10;
          local_190._8_8_ = (char *)0x0;
          local_180[0]._M_allocated_capacity =
               local_180[0]._M_allocated_capacity & 0xffffffffffffff00;
          bVar5 = ConsumeString(this,(string *)local_190);
          if (bVar5) {
            pFVar1 = this->finder_;
            if (pFVar1 == (Finder *)0x0) {
              factory = (MessageFactory *)0x0;
            }
            else {
              iVar7 = (*pFVar1->_vptr_Finder[5])(pFVar1,paVar11);
              factory = (MessageFactory *)CONCAT44(extraout_var_04,iVar7);
            }
            this_02 = &Reflection::MutableMessage
                                 (local_158,message,(FieldDescriptor *)paVar11->_M_local_buf,factory
                                 )->super_MessageLite;
            MessageLite::ParseFromString(this_02,(string *)local_190);
          }
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
          }
          if (!bVar5) goto LAB_002aa2d0;
        }
        else {
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_190,":","");
          bVar5 = Consume(this,(string *)local_190);
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
          }
          if (!bVar5) goto LAB_002aa2d0;
LAB_002a9803:
          if (*(int *)(paVar11->_M_local_buf + 0x3c) == 3) {
            local_190._0_8_ = local_190 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[","");
            bVar5 = TryConsume(this,(string *)local_190);
            if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
              operator_delete((void *)local_190._0_8_);
            }
            if (bVar5) {
              local_190._0_8_ = local_190 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]","");
              bVar5 = TryConsume(this,(string *)local_190);
              if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
                operator_delete((void *)local_190._0_8_);
              }
              if (!bVar5) {
                do {
                  if (*(once_flag **)(paVar11->_M_local_buf + 0x30) != (once_flag *)0x0) {
                    local_190._0_8_ = FieldDescriptor::TypeOnceInit;
                    local_130._M_dataplus._M_p = (pointer)paVar11;
                    std::
                    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                              (*(once_flag **)(paVar11->_M_local_buf + 0x30),
                               (_func_void_FieldDescriptor_ptr **)local_190,
                               (FieldDescriptor **)&local_130);
                  }
                  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                              (ulong)*(uint *)(paVar11->_M_local_buf + 0x38) * 4) == 10) {
                    bVar5 = ConsumeFieldMessage(this,message,local_158,
                                                (FieldDescriptor *)paVar11->_M_local_buf);
                  }
                  else {
                    bVar5 = ConsumeFieldValue(this,message,local_158,
                                              (FieldDescriptor *)paVar11->_M_local_buf);
                  }
                  if (bVar5 == false) goto LAB_002aa2d0;
                  local_190._0_8_ = local_190 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]","");
                  bVar5 = TryConsume(this,(string *)local_190);
                  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
                    operator_delete((void *)local_190._0_8_);
                  }
                  if (bVar5) goto LAB_002aa338;
                  local_190._0_8_ = local_190 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,",","");
                  bVar6 = Consume(this,(string *)local_190);
                  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
                    operator_delete((void *)local_190._0_8_);
                  }
                  bVar5 = false;
                } while (bVar6);
                goto LAB_002aa2d2;
              }
              goto LAB_002aa338;
            }
          }
          CVar8 = FieldDescriptor::cpp_type((FieldDescriptor *)paVar11->_M_local_buf);
          if (CVar8 == CPPTYPE_MESSAGE) {
            bVar5 = ConsumeFieldMessage(this,message,local_158,
                                        (FieldDescriptor *)paVar11->_M_local_buf);
          }
          else {
            bVar5 = ConsumeFieldValue(this,message,local_158,
                                      (FieldDescriptor *)paVar11->_M_local_buf);
          }
          if (bVar5 == false) goto LAB_002aa2d0;
        }
LAB_002aa338:
        local_190._0_8_ = local_190 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,";","");
        bVar5 = TryConsume(this,(string *)local_190);
        if (!bVar5) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,",","");
          TryConsume(this,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if (*(char *)(*(long *)(paVar11->_M_local_buf + 0x78) + 0x4e) == '\x01') {
          std::operator+(&local_130,"text format contains deprecated field \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          local_190._0_8_ = local_190 + 0x10;
          pcVar19 = (code *)(puVar16 + 2);
          if ((code *)*puVar16 == pcVar19) {
            local_180[0]._0_8_ = *(undefined8 *)pcVar19;
            local_180[0]._8_8_ = puVar16[3];
          }
          else {
            local_180[0]._0_8_ = *(undefined8 *)pcVar19;
            local_190._0_8_ = (code *)*puVar16;
          }
          local_190._8_8_ = puVar16[1];
          *puVar16 = pcVar19;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)local_190);
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
        }
        bVar5 = true;
        if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
          ParseInfoTree::RecordLocation
                    (this->parse_info_tree_,(FieldDescriptor *)paVar11->_M_local_buf,local_a8);
        }
        goto LAB_002aa2d2;
      }
      if ((*(int *)(paVar11->_M_local_buf + 0x3c) == 3) ||
         (bVar5 = Reflection::HasField(local_158,message,(FieldDescriptor *)paVar11->_M_local_buf),
         !bVar5)) {
        oneof_descriptor = *(OneofDescriptor **)(paVar11->_M_local_buf + 0x58);
        if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
           (bVar5 = Reflection::HasOneof(local_158,message,oneof_descriptor), !bVar5))
        goto LAB_002a96d0;
        pFVar15 = Reflection::GetOneofFieldDescriptor(local_158,message,oneof_descriptor);
        std::operator+(&local_90,"Field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        psVar17 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_c8.field_2._M_allocated_capacity = *psVar17;
          local_c8.field_2._8_8_ = puVar16[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar17;
          local_c8._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_c8._M_string_length = puVar16[1];
        *puVar16 = psVar17;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::operator+(&local_110,&local_c8,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        pFVar15);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar11) {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150.field_2._8_8_ = puVar16[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_150._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_150._M_string_length = puVar16[1];
        *puVar16 = paVar11;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::operator+(&local_130,&local_150,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        oneof_descriptor);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        local_190._0_8_ = local_190 + 0x10;
        pcVar19 = (code *)(puVar16 + 2);
        if ((code *)*puVar16 == pcVar19) {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_180[0]._8_8_ = puVar16[3];
        }
        else {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_190._0_8_ = (code *)*puVar16;
        }
        local_190._8_8_ = puVar16[1];
        *puVar16 = pcVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        paVar11 = &local_90.field_2;
      }
      else {
        std::operator+(&local_130,"Non-repeated field \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_190._0_8_ = local_190 + 0x10;
        pcVar19 = (code *)(plVar13 + 2);
        if ((code *)*plVar13 == pcVar19) {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_180[0]._8_8_ = plVar13[3];
        }
        else {
          local_180[0]._0_8_ = *(undefined8 *)pcVar19;
          local_190._0_8_ = (code *)*plVar13;
        }
        local_190._8_8_ = plVar13[1];
        *plVar13 = (long)pcVar19;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_);
        }
        paVar11 = &local_130.field_2;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar11->_M_allocated_capacity)[-2] != paVar11) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar11->_M_allocated_capacity)[-2]);
    }
  }
LAB_002aa2d0:
  bVar5 = false;
LAB_002aa2d2:
  if ((Reflection *)local_f0._0_8_ != (Reflection *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_);
  }
  return bVar5;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }